

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramInputOutputReferencedByCase::iterate
          (ProgramInputOutputReferencedByCase *this)

{
  RenderContext *renderCtx;
  Program *programDefinition;
  int iVar1;
  deUint32 dVar2;
  ShaderType SVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  bool bVar5;
  char *pcVar6;
  ShaderType SVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  GLint value;
  GLenum prop;
  string targetResourceName;
  GLint written;
  long local_2a0;
  int local_298;
  Storage local_294;
  Enum<int,_2UL> local_290;
  undefined1 local_280 [8];
  pointer local_278 [14];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0 [8];
  ShaderProgram program;
  
  local_294 = this->m_targetStorage;
  bVar9 = local_294 == STORAGE_IN;
  bVar10 = local_294 == STORAGE_PATCH_IN;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2a0 = CONCAT44(extraout_var,iVar1);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources((ProgramSources *)local_280,this->m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_280);
  bVar5 = bVar9 || bVar10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)local_278 + lVar8 + -8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pcVar6 = "shaderOutput";
  if (bVar9 || bVar10) {
    pcVar6 = "shaderInput";
  }
  targetResourceName._M_dataplus._M_p = (pointer)&targetResourceName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&targetResourceName,pcVar6,pcVar6 + (0xc - (ulong)bVar5));
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  programDefinition = this->m_program;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  checkAndLogProgram(&program,programDefinition,(Functions *)CONCAT44(extraout_var_00,iVar1),
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_298 = 0x92e4 - (uint)bVar5;
  iVar1 = (**(code **)(local_2a0 + 0x9a8))
                    (program.m_program.m_program,local_298,targetResourceName._M_dataplus._M_p);
  dVar2 = (**(code **)(local_2a0 + 0x800))();
  glu::checkError(dVar2,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0xbe3);
  if (iVar1 == -1) {
    local_280 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"Error, query for resource \"",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,targetResourceName._M_dataplus._M_p,
               targetResourceName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\" index returned invalid index.",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    std::ios_base::~ios_base(local_208);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "could not find target resource");
  }
  else {
    lVar8 = 8;
    do {
      pcVar6 = *(char **)((long)&iterate::targetProps[0].propName + lVar8);
      if ((pcVar6 == (char *)0x0) ||
         (bVar5 = glu::ContextInfo::isExtensionSupported
                            (((this->super_TestCase).m_context)->m_contextInfo,pcVar6), bVar5)) {
        prop = *(GLenum *)((long)&PTR_typeinfo_00b354b8 + lVar8);
        if ((local_294 == STORAGE_PATCH_IN) || (local_294 == STORAGE_IN)) {
          SVar7 = *(ShaderType *)((long)&PTR_typeinfo_00b354b8 + lVar8 + 4);
          SVar3 = ProgramInterfaceDefinition::Program::getFirstStage(this->m_program);
        }
        else {
          SVar7 = *(ShaderType *)((long)&PTR_typeinfo_00b354b8 + lVar8 + 4);
          SVar3 = ProgramInterfaceDefinition::Program::getLastStage(this->m_program);
        }
        bVar5 = SVar7 == SVar3;
        value = -1;
        written = -1;
        local_280 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Verifying ",10);
        pcVar6 = glu::getProgramResourcePropertyName(prop);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)local_278[0][-1]._M_string_length + (int)(ostringstream *)local_278);
        }
        else {
          sVar4 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,", expecting ",0xc);
        pcVar6 = "FALSE";
        if (bVar5) {
          pcVar6 = "TRUE";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,pcVar6,(ulong)bVar5 ^ 5);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        (**(code **)(local_2a0 + 0x9c8))
                  (program.m_program.m_program,local_298,iVar1,1,&prop,1,&written,&value);
        dVar2 = (**(code **)(local_2a0 + 0x800))();
        glu::checkError(dVar2,"query buffer binding",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0xbf9);
        if (written == 1) {
          local_280 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
          pcVar6 = glu::getProgramResourcePropertyName(prop);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)local_278 + (int)local_278[0][-1]._M_string_length);
          }
          else {
            sVar4 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," = ",3);
          local_290.m_getName = glu::getBooleanName;
          local_290.m_value = value;
          tcu::Format::Enum<int,_2UL>::toStream(&local_290,(ostream *)local_278);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
          std::ios_base::~ios_base(local_208);
          if (value == (uint)bVar5) goto LAB_00540a83;
          local_280 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"Error, got unexpected value",0x1b);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
          std::ios_base::~ios_base(local_208);
          pcVar6 = "unexpected property value";
        }
        else {
          local_280 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,
                     "Error, query for referenced_by_* returned invalid number of values.",0x43);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
          std::ios_base::~ios_base(local_208);
          pcVar6 = "property query failed";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,pcVar6);
      }
LAB_00540a83:
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetResourceName._M_dataplus._M_p != &targetResourceName.field_2) {
    operator_delete(targetResourceName._M_dataplus._M_p,
                    targetResourceName.field_2._M_allocated_capacity + 1);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

ProgramInputOutputReferencedByCase::IterateResult ProgramInputOutputReferencedByCase::iterate (void)
{
	static const struct
	{
		glw::GLenum		propName;
		glu::ShaderType	shaderType;
		const char*		extension;
	} targetProps[] =
	{
		{ GL_REFERENCED_BY_VERTEX_SHADER,			glu::SHADERTYPE_VERTEX,						DE_NULL							},
		{ GL_REFERENCED_BY_FRAGMENT_SHADER,			glu::SHADERTYPE_FRAGMENT,					DE_NULL							},
		{ GL_REFERENCED_BY_COMPUTE_SHADER,			glu::SHADERTYPE_COMPUTE,					DE_NULL							},
		{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		glu::SHADERTYPE_TESSELLATION_CONTROL,		"GL_EXT_tessellation_shader"	},
		{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	glu::SHADERTYPE_TESSELLATION_EVALUATION,	"GL_EXT_tessellation_shader"	},
		{ GL_REFERENCED_BY_GEOMETRY_SHADER,			glu::SHADERTYPE_GEOMETRY,					"GL_EXT_geometry_shader"		},
	};

	const bool					isInputCase						= (m_targetStorage == glu::STORAGE_IN || m_targetStorage == glu::STORAGE_PATCH_IN);
	const glw::Functions&		gl								= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	const std::string			targetResourceName				= (isInputCase) ? ("shaderInput") : ("shaderOutput");
	const glw::GLenum			programGLInterface				= (isInputCase) ? (GL_PROGRAM_INPUT) : (GL_PROGRAM_OUTPUT);
	glw::GLuint					resourceIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// find target resource index

	resourceIndex = gl.getProgramResourceIndex(program.getProgram(), programGLInterface, targetResourceName.c_str());
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (resourceIndex == GL_INVALID_INDEX)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for resource \"" << targetResourceName << "\" index returned invalid index." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "could not find target resource");
		return STOP;
	}

	// check props
	for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(targetProps); ++propNdx)
	{
		if (targetProps[propNdx].extension == DE_NULL || m_context.getContextInfo().isExtensionSupported(targetProps[propNdx].extension))
		{
			const glw::GLenum	prop			= targetProps[propNdx].propName;
			const bool			expected		= (isInputCase) ? (targetProps[propNdx].shaderType == m_program->getFirstStage()) : (targetProps[propNdx].shaderType == m_program->getLastStage());
			glw::GLint			value			= -1;
			glw::GLint			written			= -1;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying " << glu::getProgramResourcePropertyName(prop) << ", expecting " << ((expected) ? ("TRUE") : ("FALSE")) << tcu::TestLog::EndMessage;

			gl.getProgramResourceiv(program.getProgram(), programGLInterface, resourceIndex, 1, &prop, 1, &written, &value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer binding");

			if (written != 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for referenced_by_* returned invalid number of values." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "property query failed");
				continue;
			}

			m_testCtx.getLog() << tcu::TestLog::Message << glu::getProgramResourcePropertyName(prop) << " = " << glu::getBooleanStr(value) << tcu::TestLog::EndMessage;

			if (value != ((expected) ? (GL_TRUE) : (GL_FALSE)))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected value" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "unexpected property value");
				continue;
			}
		}
	}

	return STOP;
}